

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  bool bVar1;
  size_t sVar2;
  TextRange *pTVar3;
  bool local_3a;
  bool local_39;
  TextRange *f;
  undefined1 local_20 [4];
  int i;
  TextRange input_range;
  ImGuiTextFilter *this_local;
  
  input_range.e = this->InputBuf;
  ImVector<ImGuiTextFilter::TextRange>::resize(&this->Filters,0);
  sVar2 = strlen(this->InputBuf);
  TextRange::TextRange((TextRange *)local_20,this->InputBuf,this->InputBuf + sVar2);
  TextRange::split((TextRange *)local_20,',',&this->Filters);
  this->CountGrep = 0;
  for (f._4_4_ = 0; f._4_4_ != (this->Filters).Size; f._4_4_ = f._4_4_ + 1) {
    pTVar3 = ImVector<ImGuiTextFilter::TextRange>::operator[](&this->Filters,f._4_4_);
    while( true ) {
      local_39 = false;
      if (pTVar3->b < pTVar3->e) {
        local_39 = ImCharIsBlankA(*pTVar3->b);
      }
      if (local_39 == false) break;
      pTVar3->b = pTVar3->b + 1;
    }
    while( true ) {
      local_3a = false;
      if (pTVar3->b < pTVar3->e) {
        local_3a = ImCharIsBlankA(pTVar3->e[-1]);
      }
      if (local_3a == false) break;
      pTVar3->e = pTVar3->e + -1;
    }
    bVar1 = TextRange::empty(pTVar3);
    if ((!bVar1) &&
       (pTVar3 = ImVector<ImGuiTextFilter::TextRange>::operator[](&this->Filters,f._4_4_),
       *pTVar3->b != '-')) {
      this->CountGrep = this->CountGrep + 1;
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        TextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}